

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cycles.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int __how;
  msg_stop *msg;
  actor_ref *this;
  msg_stop local_35;
  int local_34;
  duration<long,_std::ratio<1L,_1L>_> local_30;
  msg_start local_25 [13];
  actor_ref local_18;
  actor_ref analizer;
  
  analizer.object_._4_4_ = 0;
  acto::spawn<Analizer>((actor_thread)&local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"Statistic is being collected.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Please wait some seconds...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  acto::actor_ref::send<msg_start>(&local_18,local_25);
  local_34 = 5;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_30,&local_34);
  acto::this_thread::sleep_for<std::chrono::duration<long,std::ratio<1l,1l>>>(local_30);
  msg = &local_35;
  acto::actor_ref::send<msg_stop>(&local_18,msg);
  __how = (int)msg;
  acto::join(&local_18);
  this = &local_18;
  acto::actor_ref::~actor_ref(this);
  acto::shutdown((int)this,__how);
  poVar1 = std::operator<<((ostream *)&std::cout,":end");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main() {
  {
    acto::actor_ref analizer = acto::spawn< Analizer >(acto::actor_thread::exclusive);
    // -
    std::cout << "Statistic is being collected." << std::endl;
    std::cout << "Please wait some seconds..." << std::endl;
    // Запустить выполнение примера
    analizer.send(msg_start());

    acto::this_thread::sleep_for(std::chrono::seconds(5));
    // Оставноваить выполнение и собрать статистику
    analizer.send(msg_stop());

    acto::join(analizer);
  }
  // Освободить ресурсы
  acto::shutdown();

  std::cout << ":end" << std::endl;

#ifdef ACTO_WIN
  _getch();
#endif

  return 0;
}